

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  char cVar1;
  connectdata *pcVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  curl_slist *pcVar11;
  char *pcVar12;
  undefined7 in_register_00000031;
  curl_slist *h [2];
  CURLcode local_74;
  long local_70;
  curl_slist *local_58 [3];
  dynbuf *local_40;
  long local_38;
  
  local_40 = req;
  pcVar2 = data->conn;
  uVar5 = 2;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    uVar5 = *(uint *)&(pcVar2->bits).field_0x4;
    uVar5 = (uVar5 & 8) == 0 & uVar5;
  }
  if (uVar5 == 2) {
    if (((data->set).field_0x8e2 & 2) == 0) goto LAB_0053c8c2;
    local_58[0] = (data->set).proxyheaders;
  }
  else {
    if (uVar5 == 1) {
      local_58[0] = (data->set).headers;
      local_70 = 1;
      if (((data->set).field_0x8e2 & 2) != 0) {
        local_58[1] = (data->set).proxyheaders;
        local_70 = 2;
      }
      goto LAB_0053c8e1;
    }
LAB_0053c8c2:
    local_58[0] = (data->set).headers;
  }
  local_70 = 1;
LAB_0053c8e1:
  local_38 = 0;
  do {
    pcVar11 = local_58[local_38];
LAB_0053c8f2:
    if (pcVar11 != (curl_slist *)0x0) {
      pcVar10 = pcVar11->data;
      pcVar8 = strchr(pcVar10,0x3a);
      if (pcVar8 == (char *)0x0) {
        pcVar9 = strchr(pcVar10,0x3b);
        bVar3 = true;
        pcVar12 = pcVar9;
        pcVar8 = pcVar9;
        if (pcVar9 != (char *)0x0) {
          do {
            cVar1 = pcVar8[1];
            if ((cVar1 != '\t') && (cVar1 != ' ')) {
              if (cVar1 == '\0') goto LAB_0053c965;
              if (3 < (byte)(cVar1 - 10U)) goto LAB_0053c95d;
            }
            pcVar12 = pcVar12 + 1;
            pcVar8 = pcVar8 + 1;
          } while( true );
        }
        pcVar10 = (char *)0x0;
        pcVar8 = (char *)0x0;
        goto LAB_0053c99d;
      }
      pcVar10 = (char *)0x0;
      goto LAB_0053c9a6;
    }
    local_38 = local_38 + 1;
    if (local_38 == local_70) {
      return CURLE_OK;
    }
  } while( true );
LAB_0053c95d:
  if (cVar1 == '\0') {
LAB_0053c965:
    if (*pcVar8 != ';') goto LAB_0053c995;
    pcVar10 = (*Curl_cstrdup)(pcVar10);
    if (pcVar10 == (char *)0x0) {
      Curl_dyn_free(local_40);
      local_74 = CURLE_OUT_OF_MEMORY;
      pcVar10 = (char *)0x0;
      bVar3 = false;
    }
    else {
      pcVar12[(long)pcVar10 - (long)pcVar11->data] = ':';
      pcVar8 = pcVar12 + ((long)pcVar10 - (long)pcVar11->data);
    }
  }
  else {
    pcVar9 = (char *)0x0;
LAB_0053c995:
    pcVar10 = (char *)0x0;
    pcVar8 = pcVar9;
  }
LAB_0053c99d:
  CVar7 = local_74;
  if (bVar3) {
LAB_0053c9a6:
    if ((pcVar8 != (char *)0x0) && (pcVar8 != pcVar11->data)) {
      do {
        do {
          pcVar8 = pcVar8 + 1;
          cVar1 = *pcVar8;
        } while (cVar1 == '\t');
      } while ((cVar1 == ' ') || ((cVar1 != '\0' && ((byte)(cVar1 - 10U) < 4))));
      if ((pcVar10 != (char *)0x0) || (cVar1 != '\0')) {
        pcVar8 = pcVar11->data;
        if (pcVar10 != (char *)0x0) {
          pcVar8 = pcVar10;
        }
        if ((((((data->state).aptr.host == (char *)0x0) ||
              (iVar6 = curl_strnequal(pcVar8,"Host:",5), iVar6 == 0)) &&
             (((data->state).httpreq != '\x02' ||
              (iVar6 = curl_strnequal(pcVar8,"Content-Type:",0xd), iVar6 == 0)))) &&
            (((data->state).httpreq != '\x03' ||
             (iVar6 = curl_strnequal(pcVar8,"Content-Type:",0xd), iVar6 == 0)))) &&
           (((((pcVar2->bits).field_0x6 & 1) == 0 ||
             (iVar6 = curl_strnequal(pcVar8,"Content-Length:",0xf), iVar6 == 0)) &&
            (((((data->state).aptr.te == (char *)0x0 ||
               (iVar6 = curl_strnequal(pcVar8,"Connection:",0xb), iVar6 == 0)) &&
              ((pcVar2->httpversion < 0x14 ||
               (iVar6 = curl_strnequal(pcVar8,"Transfer-Encoding:",0x12), iVar6 == 0)))) &&
             (((iVar6 = curl_strnequal(pcVar8,"Authorization:",0xe), iVar6 == 0 &&
               (iVar6 = curl_strnequal(pcVar8,"Cookie:",7), iVar6 == 0)) ||
              (_Var4 = Curl_auth_allowed_to_host(data), _Var4)))))))) {
          CVar7 = Curl_dyn_addf(local_40,"%s\r\n",pcVar8);
        }
        else {
          CVar7 = CURLE_OK;
        }
        if (pcVar10 != (char *)0x0) {
          (*Curl_cfree)(pcVar10);
        }
        if (CVar7 != CURLE_OK) goto LAB_0053cb4b;
      }
    }
    pcVar11 = pcVar11->next;
    bVar3 = true;
  }
  else {
LAB_0053cb4b:
    local_74 = CVar7;
    bVar3 = false;
  }
  if (!bVar3) {
    return local_74;
  }
  goto LAB_0053c8f2;
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr && (ptr != headers->data)) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  !Curl_auth_allowed_to_host(data))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}